

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LinkedModel::LinkedModel(LinkedModel *this,LinkedModel *from)

{
  LinkTypeCase LVar1;
  InternalMetadataWithArenaLite *this_00;
  LinkedModelFile *this_01;
  LinkedModelFile *from_00;
  LinkedModel *from_local;
  LinkedModel *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LinkedModel_00577570;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  LinkTypeUnion::LinkTypeUnion((LinkTypeUnion *)&this->LinkType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  clear_has_LinkType(this);
  LVar1 = LinkType_case(from);
  if ((LVar1 != LINKTYPE_NOT_SET) && (LVar1 == kLinkedModelFile)) {
    this_01 = mutable_linkedmodelfile(this);
    from_00 = linkedmodelfile(from);
    LinkedModelFile::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

LinkedModel::LinkedModel(const LinkedModel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_LinkType();
  switch (from.LinkType_case()) {
    case kLinkedModelFile: {
      mutable_linkedmodelfile()->::CoreML::Specification::LinkedModelFile::MergeFrom(from.linkedmodelfile());
      break;
    }
    case LINKTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LinkedModel)
}